

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

void __thiscall Model::AddSpecies(Model *this,string *name,int copy_number)

{
  int iVar1;
  SpeciesTracker *this_00;
  invalid_argument *this_01;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  std::__cxx11::string::substr((ulong)local_40,(ulong)name);
  iVar1 = std::__cxx11::string::compare((char *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if (iVar1 != 0) {
    this_00 = SpeciesTracker::Instance();
    SpeciesTracker::Increment(this_00,name,copy_number);
    return;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_01,"Names prefixed with \'__\' (double underscore) are reserved for internal use."
            );
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Model::AddSpecies(const std::string &name, int copy_number) {
  if (name.substr(0, 2) == "__") {
    throw std::invalid_argument(
        "Names prefixed with '__' (double underscore) are reserved for "
        "internal use.");
  }
  auto &tracker = SpeciesTracker::Instance();
  tracker.Increment(name, copy_number);
}